

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O1

common_chat_msg *
parse_prefixed_json_tool_call_array
          (common_chat_msg *__return_storage_ptr__,string *input,string *prefix,size_t rstrip_prefix
          )

{
  bool bVar1;
  long lVar2;
  reference tool_call;
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  tool_calls;
  iterator __end2;
  iterator __begin2;
  data local_108;
  common_chat_tool_call local_f8;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  iterator local_70;
  iterator local_50;
  
  lVar2 = std::__cxx11::string::find((char *)input,(ulong)(prefix->_M_dataplus)._M_p,0);
  (__return_storage_ptr__->role)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->role).field_2
  ;
  (__return_storage_ptr__->role)._M_string_length = 0;
  (__return_storage_ptr__->role).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->content)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->content).field_2;
  (__return_storage_ptr__->content)._M_string_length = 0;
  (__return_storage_ptr__->content).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->content_parts).
  super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->content_parts).
  super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->content_parts).
  super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->tool_calls).
  super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->tool_calls).
  super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->tool_calls).
  super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->reasoning_content)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->reasoning_content).field_2;
  (__return_storage_ptr__->reasoning_content)._M_string_length = 0;
  (__return_storage_ptr__->reasoning_content).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->tool_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->tool_name).field_2;
  (__return_storage_ptr__->tool_name)._M_string_length = 0;
  (__return_storage_ptr__->tool_name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->tool_call_id)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->tool_call_id).field_2;
  (__return_storage_ptr__->tool_call_id)._M_string_length = 0;
  (__return_storage_ptr__->tool_call_id).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x222fb3);
  if (lVar2 == -1) {
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->content);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_f8,(ulong)input);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->content,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.name._M_dataplus._M_p != &local_f8.name.field_2) {
      operator_delete(local_f8.name._M_dataplus._M_p,local_f8.name.field_2._M_allocated_capacity + 1
                     );
    }
    std::__cxx11::string::substr((ulong)&local_f8,(ulong)input);
    local_88 = (code *)0x0;
    uStack_80 = 0;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::parse<std::__cxx11::string>
              ((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)&local_108,&local_f8.name,(parser_callback_t *)&local_98,true,false);
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.name._M_dataplus._M_p != &local_f8.name.field_2) {
      operator_delete(local_f8.name._M_dataplus._M_p,local_f8.name.field_2._M_allocated_capacity + 1
                     );
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin(&local_50,
            (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)&local_108);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::end(&local_70,
          (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           *)&local_108);
    while( true ) {
      bVar1 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::
              operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                        (&local_50,&local_70);
      if (bVar1) break;
      tool_call = nlohmann::json_abi_v3_11_3::detail::
                  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::operator*(&local_50);
      process_tool_call(&local_f8,tool_call);
      std::vector<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>::
      emplace_back<common_chat_tool_call>(&__return_storage_ptr__->tool_calls,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.id._M_dataplus._M_p != &local_f8.id.field_2) {
        operator_delete(local_f8.id._M_dataplus._M_p,local_f8.id.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.arguments._M_dataplus._M_p != &local_f8.arguments.field_2) {
        operator_delete(local_f8.arguments._M_dataplus._M_p,
                        local_f8.arguments.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.name._M_dataplus._M_p != &local_f8.name.field_2) {
        operator_delete(local_f8.name._M_dataplus._M_p,
                        local_f8.name.field_2._M_allocated_capacity + 1);
      }
      nlohmann::json_abi_v3_11_3::detail::
      iter_impl<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
      ::operator++(&local_50);
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_108,false);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_108);
  }
  return __return_storage_ptr__;
}

Assistant:

static common_chat_msg parse_prefixed_json_tool_call_array(const std::string& input, const std::string & prefix, size_t rstrip_prefix = 0) {
    auto content_end = input.find(prefix);
    size_t tc_start = std::string::npos;

    common_chat_msg result;
    result.role = "assistant";
    if (content_end == std::string::npos) {
        result.content = input;
    } else {
        tc_start = content_end + prefix.size() - rstrip_prefix;
        result.content = input.substr(0, content_end);
        auto tool_calls = json::parse(input.substr(tc_start));
        for (const auto & tool_call : tool_calls) {
            result.tool_calls.emplace_back(process_tool_call(tool_call));
        }
    }
    return result;
}